

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

spv_result_t spvtools::val::anon_unknown_2::ValidateForwardDecls(ValidationState_t *_)

{
  size_t sVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  __string_type id_str;
  stringstream ss;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_400;
  long *local_3e8;
  long local_3e0;
  long local_3d8 [2];
  long *local_3c8 [2];
  long local_3b8 [2];
  undefined1 local_3a8 [16];
  code *local_398;
  undefined8 local_390;
  ValidationState_t *local_388;
  stringstream local_380 [16];
  undefined1 local_370 [112];
  ios_base local_300 [264];
  DiagnosticStream local_1f8;
  
  sVar1 = ValidationState_t::unresolved_forward_id_count(_);
  if (sVar1 == 0) {
    local_1f8.error_ = SPV_SUCCESS;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_380);
    ValidationState_t::UnresolvedForwardIds(&local_400,_);
    local_3a8._0_8_ = local_370;
    local_3a8._8_8_ = " ";
    local_398 = ValidationState_t::getIdName_abi_cxx11_;
    local_390 = 0;
    local_388 = _;
    std::
    transform<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>,std::_Bind<std::__cxx11::string(spvtools::val::ValidationState_t::*(std::reference_wrapper<spvtools::val::ValidationState_t>,std::_Placeholder<1>))(unsigned_int)const>>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )&local_1f8,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )local_400.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
                *)local_400.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish,
               (_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(spvtools::val::ValidationState_t::*(std::reference_wrapper<spvtools::val::ValidationState_t>,_std::_Placeholder<1>))(unsigned_int)_const>
                *)local_3a8);
    std::__cxx11::stringbuf::str();
    ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_ID,(Instruction *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"The following forward referenced IDs have not been defined:\n"
               ,0x3c);
    std::__cxx11::string::substr((ulong)&local_3e8,(ulong)local_3c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,(char *)local_3e8,local_3e0);
    if (local_3e8 != local_3d8) {
      operator_delete(local_3e8,local_3d8[0] + 1);
    }
    DiagnosticStream::~DiagnosticStream(&local_1f8);
    if (local_3c8[0] != local_3b8) {
      operator_delete(local_3c8[0],local_3b8[0] + 1);
    }
    if (local_400.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_400.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_400.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_400.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__cxx11::stringstream::~stringstream(local_380);
    std::ios_base::~ios_base(local_300);
  }
  return local_1f8.error_;
}

Assistant:

spv_result_t ValidateForwardDecls(ValidationState_t& _) {
  if (_.unresolved_forward_id_count() == 0) return SPV_SUCCESS;

  std::stringstream ss;
  std::vector<uint32_t> ids = _.UnresolvedForwardIds();

  std::transform(
      std::begin(ids), std::end(ids),
      std::ostream_iterator<std::string>(ss, " "),
      bind(&ValidationState_t::getIdName, std::ref(_), std::placeholders::_1));

  auto id_str = ss.str();
  return _.diag(SPV_ERROR_INVALID_ID, nullptr)
         << "The following forward referenced IDs have not been defined:\n"
         << id_str.substr(0, id_str.size() - 1);
}